

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O2

void __thiscall
leveldb::TableBuilder::WriteRawBlock
          (TableBuilder *this,Slice *block_contents,CompressionType type,BlockHandle *handle)

{
  Status *this_00;
  Rep *pRVar1;
  uint32_t uVar2;
  char trailer [5];
  Status local_40;
  Status local_38;
  undefined8 local_30;
  
  pRVar1 = this->rep_;
  handle->offset_ = pRVar1->offset;
  handle->size_ = block_contents->size_;
  (*pRVar1->file->_vptr_WritableFile[2])(&local_38,pRVar1->file,block_contents);
  this_00 = &pRVar1->status;
  Status::operator=(this_00,&local_38);
  Status::~Status(&local_38);
  if (this_00->state_ == (char *)0x0) {
    trailer[0] = (char)type;
    uVar2 = crc32c::Value(block_contents->data_,block_contents->size_);
    uVar2 = crc32c::Extend(uVar2,trailer,1);
    EncodeFixed32(trailer + 1,(uVar2 << 0x11 | uVar2 >> 0xf) + 0xa282ead8);
    local_30 = 5;
    local_38.state_ = trailer;
    (*pRVar1->file->_vptr_WritableFile[2])(&local_40);
    Status::operator=(this_00,&local_40);
    Status::~Status(&local_40);
    if (this_00->state_ == (char *)0x0) {
      pRVar1->offset = block_contents->size_ + pRVar1->offset + 5;
    }
  }
  return;
}

Assistant:

void TableBuilder::WriteRawBlock(const Slice &block_contents,
                                     CompressionType type,
                                     BlockHandle *handle) {
        Rep *r = rep_;
        handle->set_offset(r->offset);
        handle->set_size(block_contents.size());
        r->status = r->file->Append(block_contents);
        if (r->status.ok()) {
            char trailer[kBlockTrailerSize];
            trailer[0] = type;
            uint32_t crc = crc32c::Value(block_contents.data(), block_contents.size());
            crc = crc32c::Extend(crc, trailer, 1);  // Extend crc to cover block type
            EncodeFixed32(trailer + 1, crc32c::Mask(crc));
            r->status = r->file->Append(Slice(trailer, kBlockTrailerSize));
            if (r->status.ok()) {
                r->offset += block_contents.size() + kBlockTrailerSize;
            }
        }
    }